

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O3

_Bool find_subscription_by_frame_type(LIST_ITEM_HANDLE list_item,void *match_context)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  _Bool _Var3;
  
  pcVar1 = (char *)singlylinkedlist_item_get_value(list_item);
  if (pcVar1 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      _Var3 = false;
    }
    else {
      _Var3 = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
                ,"find_subscription_by_frame_type",0x41,1,
                "Could not get subscription information from the list item");
    }
  }
  else {
    _Var3 = *pcVar1 == *match_context;
  }
  return _Var3;
}

Assistant:

static bool find_subscription_by_frame_type(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    bool result;
    SUBSCRIPTION* subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(list_item);

    if (subscription == NULL)
    {
        LogError("Could not get subscription information from the list item");
        result = false;
    }
    else
    {
        result = subscription->frame_type == *((uint8_t*)match_context) ? true : false;
    }

    return result;
}